

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O1

bool __thiscall File::writeULong(File *this,unsigned_long value)

{
  uchar *__ptr;
  size_t sVar1;
  size_t sVar2;
  bool bVar3;
  ByteString toWrite;
  ByteString local_38;
  
  if (this->valid == true) {
    ByteString::ByteString(&local_38,value);
    __ptr = ByteString::const_byte_str(&local_38);
    sVar1 = ByteString::size(&local_38);
    sVar2 = fwrite(__ptr,1,sVar1,(FILE *)this->stream);
    sVar1 = ByteString::size(&local_38);
    bVar3 = sVar2 == sVar1;
    local_38._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
    std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
              (&local_38.byteString.
                super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool File::writeULong(const unsigned long value)
{
	if (!valid) return false;

	ByteString toWrite(value);

	// Write the value to the file
	if (fwrite(toWrite.const_byte_str(), 1, toWrite.size(), stream) != toWrite.size())
	{
		return false;
	}

	return true;
}